

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_runtime_api.cc
# Opt level: O0

int TVMCFuncSetReturn(TVMRetValueHandle ret,TVMValue_conflict *value,int *type_code,int num_ret)

{
  bool bVar1;
  ostringstream *poVar2;
  ostream *poVar3;
  runtime_error *_except_;
  TVMArgValue local_1e8;
  TVMRetValue *local_1d8;
  TVMRetValue *rv;
  LogCheckError local_38;
  LogCheckError _check_err;
  int num_ret_local;
  int *type_code_local;
  TVMValue_conflict *value_local;
  TVMRetValueHandle ret_local;
  
  _check_err.str._4_4_ = num_ret;
  dmlc::LogCheck_EQ((dmlc *)&local_38,num_ret,1);
  bVar1 = dmlc::LogCheckError::operator_cast_to_bool(&local_38);
  if (bVar1) {
    dmlc::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&rv,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/nthu-pllab[P]RISCV-DLR/src/runtime/c_runtime_api.cc"
               ,0x1df);
    poVar2 = dmlc::LogMessageFatal::stream_abi_cxx11_((LogMessageFatal *)&rv);
    poVar3 = std::operator<<((ostream *)poVar2,"Check failed: ");
    poVar3 = std::operator<<(poVar3,"num_ret == 1");
    poVar3 = std::operator<<(poVar3,(string *)local_38.str);
    std::operator<<(poVar3,": ");
    dmlc::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&rv);
  }
  dmlc::LogCheckError::~LogCheckError(&local_38);
  local_1d8 = (TVMRetValue *)ret;
  tvm::runtime::TVMArgValue::TVMArgValue(&local_1e8,*value,*type_code);
  tvm::runtime::TVMRetValue::operator=(local_1d8,&local_1e8);
  return 0;
}

Assistant:

int TVMCFuncSetReturn(TVMRetValueHandle ret,
                      TVMValue *value,
                      int *type_code,
                      int num_ret) {
  API_BEGIN();
  CHECK_EQ(num_ret, 1);
  TVMRetValue *rv = static_cast<TVMRetValue *>(ret);
  *rv = TVMArgValue(value[0], type_code[0]);
  API_END();
}